

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::Beta<float>(float x,float y)

{
  int iVar1;
  int *piVar2;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float in_XMM1_Da;
  float z;
  float local_4;
  
  if (Beta<float>(float,float)::ln_max == '\0') {
    iVar1 = __cxa_guard_acquire(&Beta<float>(float,float)::ln_max);
    if (iVar1 != 0) {
      std::numeric_limits<float>::max();
      Beta<float>::ln_max = ln(0.0);
      __cxa_guard_release(&Beta<float>(float,float)::ln_max);
    }
  }
  if ((in_XMM0_Da <= 0.0) || (in_XMM1_Da <= 0.0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x21;
    local_4 = std::numeric_limits<float>::signaling_NaN();
  }
  else {
    fVar3 = ln(0.0);
    if ((in_XMM0_Da + in_XMM1_Da) * fVar3 + -(in_XMM0_Da + in_XMM1_Da) <= Beta<float>::ln_max) {
      fVar3 = Gamma(0.0);
      fVar4 = Gamma(0.0);
      local_4 = Gamma(0.0);
      local_4 = (fVar3 / fVar4) * local_4;
    }
    else {
      fVar3 = ln_Gamma(0.0);
      fVar4 = ln_Gamma(0.0);
      fVar5 = ln_Gamma(0.0);
      dVar6 = std::exp((double)(ulong)(uint)((fVar3 + fVar4) - fVar5));
      local_4 = SUB84(dVar6,0);
    }
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T Beta(T x, T y) {
        static const T ln_max{ln(numeric_limits<T>::max())};
        if (x <= 0 or y <= 0) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::signaling_NaN();
        }
        const T z{x + y};
        if (z * ln(z) - z > ln_max)
          // less accurate but avoids overflow
          return exp(ln_Gamma(x) + ln_Gamma(y) - ln_Gamma(z));
        return Gamma(x) / Gamma(z) * Gamma(y);
      }